

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDependenciesCommand.cxx
# Opt level: O3

bool __thiscall
cmAddDependenciesCommand::InitialPass
          (cmAddDependenciesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *psVar1;
  cmMakefile *pcVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  cmTarget *this_00;
  ulong uVar6;
  string *arg;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
  if (uVar6 < 0x21) {
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a0);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,psVar1);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Cannot add target-level dependencies to alias target \"",0x36
                );
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".\n",3);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,psVar1,false);
    if (this_00 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "Cannot add target-level dependencies to non-existent target \"",0x3d);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"The add_dependencies works for top-level logical targets created ",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"by the add_executable, add_library, or add_custom_target commands.  ",0x44)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"If you want to add file-level dependencies see the DEPENDS option ",0x42);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"of the add_custom_target and add_custom_command commands.",0x39);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    else {
      psVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      while (psVar1 = psVar1 + 1, psVar1 != psVar3) {
        cmTarget::AddUtility(this_00,psVar1,(this->super_cmCommand).Makefile);
      }
    }
  }
  return 0x20 < uVar6;
}

Assistant:

bool cmAddDependenciesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& target_name = args[0];
  if (this->Makefile->IsAlias(target_name)) {
    std::ostringstream e;
    e << "Cannot add target-level dependencies to alias target \""
      << target_name << "\".\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
  if (cmTarget* target = this->Makefile->FindTargetToUse(target_name)) {

    // skip over target_name
    for (std::string const& arg : cmMakeRange(args).advance(1)) {
      target->AddUtility(arg, this->Makefile);
    }
  } else {
    std::ostringstream e;
    e << "Cannot add target-level dependencies to non-existent target \""
      << target_name << "\".\n"
      << "The add_dependencies works for top-level logical targets created "
      << "by the add_executable, add_library, or add_custom_target commands.  "
      << "If you want to add file-level dependencies see the DEPENDS option "
      << "of the add_custom_target and add_custom_command commands.";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }

  return true;
}